

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O3

int callout_function(pcre2_callout_block_8 *cb,void *callout_data_ptr)

{
  byte bVar1;
  PCRE2_SPTR8 pPVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  size_t __size;
  char *__ptr;
  FILE *__s;
  uint uVar10;
  uint uVar11;
  long lVar12;
  PCRE2_SPTR8 *local_40;
  int local_34;
  
  uVar6 = dat_datctl.control;
  __s = (FILE *)outfile;
  uVar10 = compiled_code8->overall_options >> 0x13 & 1;
  pPVar2 = cb->callout_string;
  if ((((byte)dat_datctl.control >> 6 | first_callout) & 1) == 0) {
    if (pPVar2 != (PCRE2_SPTR8)0x0) goto LAB_0010aff2;
LAB_0010b1b3:
    __s = (FILE *)0x0;
    local_34 = pchars8(cb->subject,(int)cb->start_match,uVar10,(FILE *)0x0);
    iVar7 = pchars8(cb->subject + cb->start_match,(int)cb->current_position - (int)cb->start_match,
                    uVar10,(FILE *)0x0);
    bVar5 = true;
  }
  else {
    if (pPVar2 == (PCRE2_SPTR8)0x0) {
      if ((dat_datctl.control & 0x40) != 0) {
LAB_0010b073:
        fprintf((FILE *)outfile,"Callout %d:",(ulong)cb->callout_number);
LAB_0010b08b:
        fprintf((FILE *)outfile," last capture = %d\n",(ulong)cb->capture_last);
        if ((cb->capture_top & 0x7fffffff) != 0) {
          uVar11 = 0;
          uVar9 = 0;
          do {
            fprintf((FILE *)outfile,"%2d: ",(ulong)uVar11);
            sVar3 = cb->offset_vector[uVar9];
            if (sVar3 == 0xffffffffffffffff) {
              fwrite("<unset>",7,1,(FILE *)outfile);
            }
            else {
              pchars8(cb->subject + sVar3,(int)cb->offset_vector[uVar9 + 1] - (int)sVar3,uVar10,
                      (FILE *)__s);
            }
            fputc(10,(FILE *)outfile);
            uVar9 = uVar9 + 2;
            uVar11 = uVar11 + 1;
          } while (uVar9 < cb->capture_top * 2);
        }
      }
    }
    else {
LAB_0010aff2:
      bVar1 = pPVar2[-1];
      uVar11 = (uint)bVar1;
      lVar12 = 0;
      fprintf((FILE *)outfile,"Callout (%lu): %c",cb->callout_string_offset,(ulong)bVar1);
      pchars8(cb->callout_string,(int)cb->callout_string_length,uVar10,outfile);
      do {
        if (*(uint *)((long)callout_start_delims + lVar12) == (uint)bVar1) {
          uVar11 = *(uint *)((long)callout_end_delims + lVar12);
          break;
        }
        lVar12 = lVar12 + 4;
      } while ((int)lVar12 != 0x20);
      fputc(uVar11,(FILE *)outfile);
      if ((uVar6 & 0x40) != 0) {
        if (cb->callout_string == (PCRE2_SPTR8)0x0) goto LAB_0010b073;
        goto LAB_0010b08b;
      }
      fputc(10,(FILE *)outfile);
    }
    if (__s == (FILE *)0x0) goto LAB_0010b1b3;
    fwrite("--->",4,1,__s);
    local_34 = pchars8(cb->subject,(int)cb->start_match,uVar10,(FILE *)__s);
    iVar7 = pchars8(cb->subject + cb->start_match,(int)cb->current_position - (int)cb->start_match,
                    uVar10,(FILE *)__s);
    bVar5 = false;
  }
  local_40 = &cb->callout_string;
  iVar8 = pchars8(cb->subject,(int)cb->subject_length,uVar10,(FILE *)0x0);
  pchars8(cb->subject + cb->current_position,(int)cb->subject_length - (int)cb->current_position,
          uVar10,(FILE *)__s);
  if (!bVar5) {
    fputc(10,__s);
  }
  iVar4 = local_34;
  if (cb->callout_number == 0xff) {
    fprintf((FILE *)outfile,"%+3d ",(ulong)(uint)cb->pattern_position);
    if (cb->pattern_position < 100) goto joined_r0x0010b2aa;
    __ptr = "\n    ";
    __size = 5;
  }
  else {
    if (((uVar6 & 0x40) == 0) && (*local_40 == (PCRE2_SPTR8)0x0)) {
      fprintf((FILE *)outfile,"%3d ");
      goto joined_r0x0010b2aa;
    }
    __ptr = "    ";
    __size = 4;
  }
  fwrite(__ptr,__size,1,(FILE *)outfile);
joined_r0x0010b2aa:
  for (; iVar4 != 0; iVar4 = iVar4 + -1) {
    fputc(0x20,(FILE *)outfile);
  }
  fputc(0x5e,(FILE *)outfile);
  iVar4 = iVar7;
  if (iVar7 != 0) {
    while (iVar4 + -1 != 0) {
      fputc(0x20,(FILE *)outfile);
      iVar4 = iVar4 + -1;
    }
    fputc(0x5e,(FILE *)outfile);
  }
  for (iVar7 = (iVar8 - (iVar7 + local_34)) + 4; iVar7 != 0; iVar7 = iVar7 + -1) {
    fputc(0x20,(FILE *)outfile);
  }
  uVar9 = 1;
  if (cb->next_item_length != 0) {
    uVar9 = cb->next_item_length & 0xffffffff;
  }
  fprintf((FILE *)outfile,"%.*s",uVar9,pbuffer8 + cb->pattern_position);
  fputc(10,(FILE *)outfile);
  first_callout = 0;
  if (cb->mark != (PCRE2_SPTR8)last_callout_mark) {
    if (cb->mark == (PCRE2_SPTR8)0x0) {
      fwrite("Latest Mark: <unset>\n",0x15,1,(FILE *)outfile);
    }
    else {
      fwrite("Latest Mark: ",0xd,1,(FILE *)outfile);
      pchars8(cb->mark,-1,uVar10,outfile);
      putc(10,(FILE *)outfile);
    }
    last_callout_mark = cb->mark;
  }
  if (callout_data_ptr != (void *)0x0) {
    uVar10 = *callout_data_ptr;
    if (uVar10 != 0) {
      fprintf((FILE *)outfile,"Callout data = %d\n",(ulong)uVar10);
      return uVar10;
    }
  }
  uVar10 = 0;
  if (cb->callout_number == dat_datctl.cfail[0]) {
    callout_count = callout_count + 1;
    uVar10 = (uint)(dat_datctl.cfail[1] <= callout_count);
  }
  return uVar10;
}

Assistant:

static int
callout_function(pcre2_callout_block_8 *cb, void *callout_data_ptr)
{
uint32_t i, pre_start, post_start, subject_length;
BOOL utf = (FLD(compiled_code, overall_options) & PCRE2_UTF) != 0;
BOOL callout_capture = (dat_datctl.control & CTL_CALLOUT_CAPTURE) != 0;

/* This FILE is used for echoing the subject. This is done only once in simple
cases. */

FILE *f = (first_callout || callout_capture || cb->callout_string != NULL)?
  outfile : NULL;

/* For a callout with a string argument, show the string first because there
isn't a tidy way to fit it in the rest of the data. */

if (cb->callout_string != NULL)
  {
  uint32_t delimiter = CODE_UNIT(cb->callout_string, -1);
  fprintf(outfile, "Callout (%lu): %c",
    (unsigned long int)cb->callout_string_offset, delimiter);
  PCHARSV(cb->callout_string, 0,
    cb->callout_string_length, utf, outfile);
  for (i = 0; callout_start_delims[i] != 0; i++)
    if (delimiter == callout_start_delims[i])
      {
      delimiter = callout_end_delims[i];
      break;
      }
  fprintf(outfile, "%c", delimiter);
  if (!callout_capture) fprintf(outfile, "\n");
  }

/* Show captured strings if required */

if (callout_capture)
  {
  if (cb->callout_string == NULL)
    fprintf(outfile, "Callout %d:", cb->callout_number);
  fprintf(outfile, " last capture = %d\n", cb->capture_last);
  for (i = 0; i < cb->capture_top * 2; i += 2)
    {
    fprintf(outfile, "%2d: ", i/2);
    if (cb->offset_vector[i] == PCRE2_UNSET)
      fprintf(outfile, "<unset>");
    else
      {
      PCHARSV(cb->subject, cb->offset_vector[i],
        cb->offset_vector[i+1] - cb->offset_vector[i], utf, f);
      }
    fprintf(outfile, "\n");
    }
  }

/* Re-print the subject in canonical form, the first time or if giving full
datails. On subsequent calls in the same match, we use pchars just to find the
printed lengths of the substrings. */

if (f != NULL) fprintf(f, "--->");

PCHARS(pre_start, cb->subject, 0, cb->start_match, utf, f);

PCHARS(post_start, cb->subject, cb->start_match,
  cb->current_position - cb->start_match, utf, f);

PCHARS(subject_length, cb->subject, 0, cb->subject_length, utf, NULL);

PCHARSV(cb->subject, cb->current_position,
  cb->subject_length - cb->current_position, utf, f);

if (f != NULL) fprintf(f, "\n");

/* For automatic callouts, show the pattern offset. Otherwise, for a numerical
callout whose number has not already been shown with captured strings, show the
number here. A callout with a string argument has been displayed above. */

if (cb->callout_number == 255)
  {
  fprintf(outfile, "%+3d ", (int)cb->pattern_position);
  if (cb->pattern_position > 99) fprintf(outfile, "\n    ");
  }
else
  {
  if (callout_capture || cb->callout_string != NULL) fprintf(outfile, "    ");
    else fprintf(outfile, "%3d ", cb->callout_number);
  }

/* Now show position indicators */

for (i = 0; i < pre_start; i++) fprintf(outfile, " ");
fprintf(outfile, "^");

if (post_start > 0)
  {
  for (i = 0; i < post_start - 1; i++) fprintf(outfile, " ");
  fprintf(outfile, "^");
  }

for (i = 0; i < subject_length - pre_start - post_start + 4; i++)
  fprintf(outfile, " ");

fprintf(outfile, "%.*s",
  (int)((cb->next_item_length == 0)? 1 : cb->next_item_length),
  pbuffer8 + cb->pattern_position);

fprintf(outfile, "\n");
first_callout = FALSE;

if (cb->mark != last_callout_mark)
  {
  if (cb->mark == NULL)
    fprintf(outfile, "Latest Mark: <unset>\n");
  else
    {
    fprintf(outfile, "Latest Mark: ");
    PCHARSV(cb->mark, 0, -1, utf, outfile);
    putc('\n', outfile);
    }
  last_callout_mark = cb->mark;
  }

if (callout_data_ptr != NULL)
  {
  int callout_data = *((int32_t *)callout_data_ptr);
  if (callout_data != 0)
    {
    fprintf(outfile, "Callout data = %d\n", callout_data);
    return callout_data;
    }
  }

return (cb->callout_number != dat_datctl.cfail[0])? 0 :
       (++callout_count >= dat_datctl.cfail[1])? 1 : 0;
}